

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O2

void NOPLL_WriteBuffered(opll_t *chip,uint32_t port,uint8_t data)

{
  byte bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int32_t buffer [2];
  int32_t aiStack_38 [2];
  
  uVar4 = (ulong)chip->writebuf_last;
  bVar1 = chip->writebuf[uVar4].port;
  if ((bVar1 & 4) != 0) {
    NOPLL_Write(chip,bVar1 & 3,chip->writebuf[uVar4].data);
    chip->writebuf_cur = chip->writebuf_last + 1 & 0x7ff;
    uVar2 = chip->writebuf[chip->writebuf_last].time;
    uVar3 = chip->writebuf_samplecnt;
    chip->writebuf_samplecnt = uVar2;
    for (lVar6 = uVar3 - uVar2; lVar6 != 0; lVar6 = lVar6 + 1) {
      NOPLL_Clock(chip,aiStack_38);
    }
    uVar4 = (ulong)chip->writebuf_last;
  }
  chip->writebuf[uVar4].port = (byte)port & 3 | 4;
  chip->writebuf[uVar4].data = data;
  uVar5 = chip->writebuf_lasttime + 0x14;
  if (uVar5 <= chip->writebuf_samplecnt) {
    uVar5 = chip->writebuf_samplecnt;
  }
  chip->writebuf[uVar4].time = uVar5;
  chip->writebuf_lasttime = uVar5;
  chip->writebuf_last = (int)uVar4 + 1U & 0x7ff;
  return;
}

Assistant:

void NOPLL_WriteBuffered(opll_t* chip, uint32_t port, uint8_t data)
{
    uint64_t time1, time2;
    int32_t buffer[2];
    uint64_t skip;

    if (chip->writebuf[chip->writebuf_last].port & 0x04)
    {
        NOPLL_Write(chip, chip->writebuf[chip->writebuf_last].port & 0x03,
            chip->writebuf[chip->writebuf_last].data);

        chip->writebuf_cur = (chip->writebuf_last + 1) % OPLL_WRITEBUF_SIZE;
        skip = chip->writebuf[chip->writebuf_last].time - chip->writebuf_samplecnt;
        chip->writebuf_samplecnt = chip->writebuf[chip->writebuf_last].time;
        while (skip--)
        {
            NOPLL_Clock(chip, buffer);
        }
    }

    chip->writebuf[chip->writebuf_last].port = (port & 0x03) | 0x04;
    chip->writebuf[chip->writebuf_last].data = data;
    time1 = chip->writebuf_lasttime + OPLL_WRITEBUF_DELAY;
    time2 = chip->writebuf_samplecnt;

    if (time1 < time2)
    {
        time1 = time2;
    }

    chip->writebuf[chip->writebuf_last].time = time1;
    chip->writebuf_lasttime = time1;
    chip->writebuf_last = (chip->writebuf_last + 1) % OPLL_WRITEBUF_SIZE;
}